

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandCaseItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,StatementSyntax *args_2)

{
  Token colon;
  RandCaseItemSyntax *pRVar1;
  StatementSyntax *in_RCX;
  BumpAllocator *in_RDX;
  RandCaseItemSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pRVar1 = (RandCaseItemSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  colon.info = unaff_retaddr;
  colon.kind = (short)in_RDI;
  colon._2_1_ = (char)((ulong)in_RDI >> 0x10);
  colon.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  colon.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::RandCaseItemSyntax::RandCaseItemSyntax
            (in_RSI,(ExpressionSyntax *)in_RDX,colon,in_RCX);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }